

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void print1Column(char *fmt,uint l1,char *c1)

{
  char *sbuf;
  char *local_40;
  char *c1buf;
  char *pc1;
  char *c1_local;
  uint l1_local;
  char *fmt_local;
  
  sbuf = (char *)malloc((ulong)(l1 + 1));
  c1buf = c1;
  if (sbuf == (char *)0x0) {
    outOfMemory();
  }
  do {
    c1buf = cutToWhiteSpace(c1buf,l1,sbuf);
    local_40 = sbuf;
    if (*sbuf == '\0') {
      local_40 = "";
    }
    printf(fmt,local_40);
  } while (c1buf != (char *)0x0);
  free(sbuf);
  return;
}

Assistant:

static void print1Column(const char* fmt, /**< The format string for formatting the output. */
                         uint l1,         /**< The width of the column. */
                         const char *c1   /**< The content of the column. */
                         )
{
    const char *pc1=c1;
    char *c1buf = (char *)malloc(l1+1);
    if (!c1buf) outOfMemory();

    do
    {
        pc1 = cutToWhiteSpace(pc1, l1, c1buf);
        printf(fmt, c1buf[0] !='\0' ? c1buf : "");
    } while (pc1);
    free(c1buf);
}